

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

pair<double,_double> __thiscall
anurbs::NurbsSurfaceGeometry<2L>::greville_point
          (NurbsSurfaceGeometry<2L> *this,Index index_u,Index index_v)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  double dVar2;
  long local_50;
  Index i_1;
  Index i;
  double v;
  double u;
  Index index_v_local;
  Index index_u_local;
  NurbsSurfaceGeometry<2L> *this_local;
  
  v = 0.0;
  i = 0;
  i_1 = 0;
  u = (double)index_v;
  index_v_local = index_u;
  index_u_local = (Index)this;
  while( true ) {
    iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])();
    if (CONCAT44(extraout_var,iVar1) <= i_1) break;
    dVar2 = knot_u(this,index_v_local + i_1);
    v = dVar2 + v;
    i_1 = i_1 + 1;
  }
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])();
  v = v / (double)CONCAT44(extraout_var_00,iVar1);
  local_50 = 0;
  while( true ) {
    iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])();
    if (CONCAT44(extraout_var_01,iVar1) <= local_50) break;
    dVar2 = knot_v(this,(long)u + local_50);
    i = (Index)(dVar2 + (double)i);
    local_50 = local_50 + 1;
  }
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])();
  i = (Index)((double)i / (double)CONCAT44(extraout_var_02,iVar1));
  std::pair<double,_double>::pair<double_&,_double_&,_true>
            ((pair<double,_double> *)&this_local,&v,(double *)&i);
  return _this_local;
}

Assistant:

std::pair<double, double> greville_point(Index index_u, Index index_v) const
    {
        double u = 0.0;
        double v = 0.0;

        for (Index i = 0; i < degree_u(); i++) {
            u += knot_u(index_u + i);
        }

        u /= degree_u();

        for (Index i = 0; i < degree_v(); i++) {
            v += knot_v(index_v + i);
        }

        v /= degree_v();

        return {u, v};
    }